

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O3

int __thiscall
pybind11::detail::process_attribute<pybind11::arg_v,_void>::init
          (process_attribute<pybind11::arg_v,_void> *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  reference pvVar2;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string descr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if ((((byte)ctx[0x59] & 0x40) != 0) && (*(long *)(ctx + 0x18) == *(long *)(ctx + 0x20))) {
    local_a0._M_dataplus._M_p = (pointer)0x0;
    local_110._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_dataplus._M_p._0_1_ = 1;
    local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffffffffff00;
    std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
    ::emplace_back<char_const(&)[5],decltype(nullptr),pybind11::handle,bool,bool>
              ((vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
                *)(ctx + 0x18),(char (*) [5])"self",(void **)(local_a8 + 8),(handle *)&local_110,
               (bool *)&local_e8,(bool *)&local_c8);
  }
  plVar3 = *(long **)(this + 0x10);
  if (plVar3 != (long *)0x0) {
    *plVar3 = *plVar3 + 1;
    local_a0._M_dataplus._M_p =
         (pointer)(CONCAT71(local_a0._M_dataplus._M_p._1_7_,~(byte)this[8]) & 0xffffffffffffff01);
    local_110._M_dataplus._M_p =
         (pointer)(CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)this[8] >> 1) &
                  0xffffffffffffff01);
    pvVar2 = std::
             vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
             ::
             emplace_back<char_const*const&,char_const*const&,pybind11::handle_const&,bool,bool_const&>
                       ((vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
                         *)(ctx + 0x18),(char **)this,(char **)(this + 0x18),(handle *)(this + 0x10)
                        ,(bool *)(local_a8 + 8),(bool *)&local_110);
    return (int)pvVar2;
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a8 + 8),"\'","");
  if (*(char **)this != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,*(char **)this,(allocator<char> *)&local_c8);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_110._M_dataplus._M_p = (pointer)*plVar3;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_110._M_dataplus._M_p == psVar4) {
      local_110.field_2._M_allocated_capacity = *psVar4;
      local_110.field_2._8_8_ = plVar3[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar4;
    }
    local_110._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append(local_a8 + 8,(ulong)local_110._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_) !=
        &local_e8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_),
                      local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  std::operator+(&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x20),
                 "\'");
  std::__cxx11::string::_M_append(local_a8 + 8,(ulong)local_110._M_dataplus._M_p);
  paVar1 = &local_110.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  __s = *(char **)ctx;
  if (((byte)ctx[0x59] & 0x40) == 0) {
    if (__s != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,__s,(allocator<char> *)&local_80);
      std::operator+(&local_e8," in function \'",&local_c8);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_110._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_110._M_dataplus._M_p == psVar4) {
        local_110.field_2._M_allocated_capacity = *psVar4;
        local_110.field_2._8_8_ = plVar3[3];
        local_110._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar4;
      }
      local_110._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append(local_a8 + 8,(ulong)local_110._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_) !=
          &local_e8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_),
                        local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    if (__s == (char *)0x0) {
      local_80._M_dataplus._M_p = (pointer)PyObject_Str(*(undefined8 *)(ctx + 0x68));
      str::operator_cast_to_string(&local_c8,(str *)&local_80);
      std::operator+(&local_e8," in method of \'",&local_c8);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_110._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_110._M_dataplus._M_p == psVar4) {
        local_110.field_2._M_allocated_capacity = *psVar4;
        local_110.field_2._8_8_ = plVar3[3];
        local_110._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar4;
      }
      local_110._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append(local_a8 + 8,(ulong)local_110._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_) !=
          &local_e8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_),
                        local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      this_00 = &local_80;
    }
    else {
      local_a8 = (undefined1  [8])PyObject_Str(*(undefined8 *)(ctx + 0x68));
      str::operator_cast_to_string(&local_40,(str *)local_a8);
      std::operator+(&local_80," in method \'",&local_40);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
      local_c8._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_c8._M_dataplus._M_p == psVar4) {
        local_c8.field_2._M_allocated_capacity = *psVar4;
        local_c8.field_2._8_8_ = plVar3[3];
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar4;
      }
      local_c8._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,*(char **)ctx,&local_e9);
      std::operator+(&local_e8,&local_c8,&local_60);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_110._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_110._M_dataplus._M_p == psVar4) {
        local_110.field_2._M_allocated_capacity = *psVar4;
        local_110.field_2._8_8_ = plVar3[3];
        local_110._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar4;
      }
      local_110._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append(local_a8 + 8,(ulong)local_110._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_) !=
          &local_e8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_),
                        local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
    }
    object::~object((object *)this_00);
  }
  std::operator+(&local_e8,"arg(): could not convert default argument ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 8)
                );
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_e8);
  local_110._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_110._M_dataplus._M_p == psVar4) {
    local_110.field_2._M_allocated_capacity = *psVar4;
    local_110.field_2._8_8_ = plVar3[3];
    local_110._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar4;
  }
  local_110._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pybind11_fail(&local_110);
}

Assistant:

static void init(const arg_v &a, function_record *r) {
        if (r->is_method && r->args.empty())
            r->args.emplace_back("self", nullptr /*descr*/, handle() /*parent*/, true /*convert*/, false /*none not allowed*/);

        if (!a.value) {
#if !defined(NDEBUG)
            std::string descr("'");
            if (a.name) descr += std::string(a.name) + ": ";
            descr += a.type + "'";
            if (r->is_method) {
                if (r->name)
                    descr += " in method '" + (std::string) str(r->scope) + "." + (std::string) r->name + "'";
                else
                    descr += " in method of '" + (std::string) str(r->scope) + "'";
            } else if (r->name) {
                descr += " in function '" + (std::string) r->name + "'";
            }
            pybind11_fail("arg(): could not convert default argument "
                          + descr + " into a Python object (type not registered yet?)");
#else
            pybind11_fail("arg(): could not convert default argument "
                          "into a Python object (type not registered yet?). "
                          "Compile in debug mode for more information.");
#endif
        }
        r->args.emplace_back(a.name, a.descr, a.value.inc_ref(), !a.flag_noconvert, a.flag_none);
    }